

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void exit_frame(flatcc_builder_t *B)

{
  __flatcc_builder_frame_t *p_Var1;
  
  memset(B->ds,0,(ulong)B->ds_offset);
  p_Var1 = B->frame;
  B->ds_offset = p_Var1->ds_offset;
  B->ds_first = p_Var1->ds_first;
  refresh_ds(B,p_Var1->type_limit);
  if (B->min_align < B->align) {
    B->min_align = B->align;
  }
  B->align = B->frame->align;
  B->frame = B->frame + -1;
  B->level = B->level + -1;
  return;
}

Assistant:

static inline void exit_frame(flatcc_builder_t *B)
{
    memset(B->ds, 0, B->ds_offset);
    B->ds_offset = frame(ds_offset);
    B->ds_first = frame(ds_first);
    refresh_ds(B, frame(type_limit));

    /*
     * Restore local alignment: e.g. a table should not change alignment
     * because a child table was just created elsewhere in the buffer,
     * but the overall alignment (min align), should be aware of it.
     * Each buffer has its own min align that then migrates up without
     * being affected by sibling or child buffers.
     */
    set_min_align(B, B->align);
    B->align = frame(align);

    --B->frame;
    --B->level;
}